

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

void __thiscall CPU::LSR_AB(CPU *this)

{
  uint16_t uVar1;
  int iVar2;
  byte bVar3;
  
  this->cycles = 6;
  uVar1 = GetWord(this);
  this->cycles = this->cycles - 1;
  iVar2 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)(uint)(byte)uVar1);
  bVar3 = (byte)iVar2;
  this->cycles = this->cycles - 1;
  (this->field_6).ps = (bVar3 < 2) * '\x02' | (this->field_6).ps & 0x7c | bVar3 & 1;
  (*this->memory->_vptr_MemoryBus[3])(this->memory,(ulong)(uint)(byte)uVar1,(ulong)(bVar3 >> 1));
  this->cycles = this->cycles - 1;
  return;
}

Assistant:

void CPU::LSR_AB()
{
    cycles = 6;
    uint8_t addr = GetWord();
    uint8_t data = ReadByte(addr);
    C = (data & 0b00000001) > 0;
    data >>= 1;
    cycles--;
    Z = (data == 0);
    N = (data & 0b10000000) > 0;
    WriteByte(addr, data);
}